

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O3

EStatusCode __thiscall
PDFDocumentHandler::CopyPageContentToTargetPageRecoded
          (PDFDocumentHandler *this,PDFPage *inPage,PDFDictionary *inPageObject)

{
  PDFParser *this_00;
  EPDFObjectType EVar1;
  EStatusCode EVar2;
  PageContentContext *inContentContext;
  PDFIndirectObjectReference *inValue;
  PDFObject *inOriginal;
  char *pcVar3;
  Trace *pTVar4;
  RefCountPtr<PDFObject> pageContent;
  SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_> it;
  PDFObjectCastPtr<PDFIndirectObjectReference> refItem;
  PDFObjectCastPtr<PDFStreamInput> contentStream;
  RefCountPtr<PDFObject> local_80;
  string local_70;
  RefCountPtr<PDFIndirectObjectReference> local_50;
  RefCountPtr<PDFStreamInput> local_40;
  
  this_00 = this->mParser;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Contents","");
  local_80.mValue = PDFParser::QueryDictionaryObject(this_00,inPageObject,&local_70);
  local_80._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a5870;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,(ulong)(local_70.field_2._M_allocated_capacity + 1));
  }
  EVar2 = eSuccess;
  if ((PDFArray *)local_80.mValue == (PDFArray *)0x0) goto LAB_001c7cbe;
  inContentContext =
       PDFHummus::DocumentContext::StartPageContentContext(this->mDocumentContext,inPage);
  EVar1 = PDFObject::GetType(local_80.mValue);
  if (EVar1 == ePDFObjectStream) {
    EVar2 = WritePDFStreamInputToContentContext
                      (this,inContentContext,(PDFStreamInput *)local_80.mValue);
LAB_001c7c9a:
    if (EVar2 == eSuccess) {
      PDFHummus::DocumentContext::EndPageContentContext(this->mDocumentContext,inContentContext);
      EVar2 = eSuccess;
      goto LAB_001c7cbe;
    }
  }
  else {
    EVar1 = PDFObject::GetType(local_80.mValue);
    if (EVar1 == ePDFObjectArray) {
      PDFArray::GetIterator((PDFArray *)local_80.mValue);
      local_50.mValue = (PDFIndirectObjectReference *)0x0;
      local_50._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a5b00;
      EVar2 = eSuccess;
      if ((pointer)local_70.field_2._M_allocated_capacity != local_70._M_dataplus._M_p) {
        do {
          if ((char)local_70._M_string_length == '\x01') {
            local_70._M_string_length._0_1_ = '\0';
            if (EVar2 != eSuccess) break;
          }
          else {
            local_70.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity + 8;
            if ((EVar2 != eSuccess) ||
               ((pointer)local_70.field_2._M_allocated_capacity == local_70._M_dataplus._M_p))
            break;
          }
          inValue = PDFObjectCast<PDFIndirectObjectReference>
                              (*(PDFObject **)local_70.field_2._M_allocated_capacity);
          RefCountPtr<PDFIndirectObjectReference>::operator=(&local_50,inValue);
          if (local_50.mValue == (PDFIndirectObjectReference *)0x0) {
            pTVar4 = Trace::DefaultTrace();
            EVar2 = eFailure;
            Trace::TraceToLog(pTVar4,
                              "PDFDocumentHandler::CopyPageContentToTargetPageRecoded, content stream array contains non-refs"
                             );
            break;
          }
          inOriginal = PDFParser::ParseNewObject(this->mParser,(local_50.mValue)->mObjectID);
          local_40.mValue = PDFObjectCast<PDFStreamInput>(inOriginal);
          local_40._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a5910;
          if (local_40.mValue == (PDFStreamInput *)0x0) {
            pTVar4 = Trace::DefaultTrace();
            Trace::TraceToLog(pTVar4,
                              "PDFDocumentHandler::CopyPageContentToTargetPageRecoded, content stream array contains references to non streams"
                             );
            RefCountPtr<PDFStreamInput>::~RefCountPtr(&local_40);
            EVar2 = eFailure;
            break;
          }
          EVar2 = WritePDFStreamInputToContentContext(this,inContentContext,local_40.mValue);
          RefCountPtr<PDFStreamInput>::~RefCountPtr(&local_40);
        } while ((pointer)local_70.field_2._M_allocated_capacity != local_70._M_dataplus._M_p);
      }
      RefCountPtr<PDFIndirectObjectReference>::~RefCountPtr(&local_50);
      goto LAB_001c7c9a;
    }
    pTVar4 = Trace::DefaultTrace();
    EVar1 = PDFObject::GetType(local_80.mValue);
    pcVar3 = PDFObject::scPDFObjectTypeLabel(EVar1);
    EVar2 = eFailure;
    Trace::TraceToLog(pTVar4,
                      "PDFDocumentHandler::CopyPageContentToTargetPageRecoded, error copying page content, expected either array or stream, getting %s"
                      ,pcVar3);
  }
  if (inContentContext != (PageContentContext *)0x0) {
    (*(inContentContext->super_AbstractContentContext)._vptr_AbstractContentContext[1])
              (inContentContext);
  }
LAB_001c7cbe:
  RefCountPtr<PDFObject>::~RefCountPtr(&local_80);
  return EVar2;
}

Assistant:

EStatusCode PDFDocumentHandler::CopyPageContentToTargetPageRecoded(PDFPage* inPage,PDFDictionary* inPageObject)
{
	EStatusCode status = PDFHummus::eSuccess;
    
	RefCountPtr<PDFObject> pageContent(mParser->QueryDictionaryObject(inPageObject,"Contents"));
    
    // for empty page, do nothing
    if(!pageContent)
        return status;
    
	PageContentContext* pageContentContext = mDocumentContext->StartPageContentContext(inPage);
	if(pageContent->GetType() == PDFObject::ePDFObjectStream)
	{
		status = WritePDFStreamInputToContentContext(pageContentContext,(PDFStreamInput*)pageContent.GetPtr());
	}
	else if(pageContent->GetType() == PDFObject::ePDFObjectArray)
	{
		SingleValueContainerIterator<PDFObjectVector> it = ((PDFArray*)pageContent.GetPtr())->GetIterator();
		PDFObjectCastPtr<PDFIndirectObjectReference> refItem;
		while(it.MoveNext() && status == PDFHummus::eSuccess)
		{
			refItem = it.GetItem();
			if(!refItem)
			{
				status = PDFHummus::eFailure;
				TRACE_LOG("PDFDocumentHandler::CopyPageContentToTargetPageRecoded, content stream array contains non-refs");
				break;
			}
			PDFObjectCastPtr<PDFStreamInput> contentStream(mParser->ParseNewObject(refItem->mObjectID));
			if(!contentStream)
			{
				status = PDFHummus::eFailure;
				TRACE_LOG("PDFDocumentHandler::CopyPageContentToTargetPageRecoded, content stream array contains references to non streams");
				break;
			}
			status = WritePDFStreamInputToContentContext(pageContentContext,contentStream.GetPtr());
		}
	}
	else
	{
		TRACE_LOG1("PDFDocumentHandler::CopyPageContentToTargetPageRecoded, error copying page content, expected either array or stream, getting %s",PDFObject::scPDFObjectTypeLabel(pageContent->GetType()));
		status = PDFHummus::eFailure;
	}
	
	if(status != PDFHummus::eSuccess)
	{
		delete pageContentContext;
	}
	else
	{
		mDocumentContext->EndPageContentContext(pageContentContext);
	}
	return status;
}